

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

errr finish_parse_trap(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  ulong uVar3;
  angband_constants *paVar4;
  trap_kind_conflict *ptVar5;
  void *pvVar6;
  undefined8 *puVar7;
  uint16_t uVar8;
  long lVar9;
  undefined8 *puVar10;
  trap_kind_conflict *ptVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  
  bVar15 = 0;
  z_info->trap_max = 0;
  pvVar6 = parser_priv(p);
  paVar4 = z_info;
  uVar8 = z_info->trap_max;
  for (; pvVar6 != (void *)0x0; pvVar6 = *(void **)((long)pvVar6 + 0x38)) {
    uVar8 = uVar8 + 1;
    paVar4->trap_max = uVar8;
  }
  trap_info = (trap_kind_conflict *)mem_zalloc((ulong)uVar8 * 0x80 + 0x80);
  uVar1 = z_info->trap_max;
  puVar7 = (undefined8 *)parser_priv(p);
  lVar14 = (ulong)uVar1 << 7;
  uVar3 = (ulong)uVar1;
  while( true ) {
    uVar12 = uVar3 - 1;
    if (puVar7 == (undefined8 *)0x0) {
      pvVar6 = parser_priv(p);
      while (pvVar6 != (void *)0x0) {
        pvVar2 = *(void **)((long)pvVar6 + 0x38);
        mem_free(pvVar6);
        pvVar6 = pvVar2;
      }
      parser_destroy(p);
      return 0;
    }
    if (uVar12 == 0xffffffffffffffff) break;
    uVar13 = uVar12 & 0xffffffff;
    puVar10 = puVar7;
    ptVar11 = trap_info + uVar13;
    for (lVar9 = 0x10; ptVar5 = trap_info, lVar9 != 0; lVar9 = lVar9 + -1) {
      ptVar11->name = (char *)*puVar10;
      puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
      ptVar11 = (trap_kind_conflict *)((long)ptVar11 + (ulong)bVar15 * -0x10 + 8);
    }
    trap_info[uVar13].tidx = (int)uVar12;
    ptVar11 = (trap_kind_conflict *)(ptVar5->flags + lVar14 + -0x68);
    if (z_info->trap_max <= uVar3) {
      ptVar11 = (trap_kind_conflict *)0x0;
    }
    ptVar5[uVar13].next = ptVar11;
    puVar7 = (undefined8 *)puVar7[7];
    lVar14 = lVar14 + -0x80;
    uVar3 = uVar12;
  }
  __assert_fail("tidx >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/init.c"
                ,0x79f,"errr finish_parse_trap(struct parser *)");
}

Assistant:

static errr finish_parse_trap(struct parser *p) {
	struct trap_kind *t, *n;
	int tidx;

	/* Scan the list for the max id */
	z_info->trap_max = 0;
	t = parser_priv(p);
	while (t) {
		z_info->trap_max++;
		t = t->next;
	}

	trap_info = mem_zalloc((z_info->trap_max + 1) * sizeof(*t));
	tidx = z_info->trap_max - 1;
    for (t = parser_priv(p); t; t = t->next, tidx--) {
		assert(tidx >= 0);

		memcpy(&trap_info[tidx], t, sizeof(*t));
		trap_info[tidx].tidx = tidx;
		if (tidx < z_info->trap_max - 1)
			trap_info[tidx].next = &trap_info[tidx + 1];
		else
			trap_info[tidx].next = NULL;
    }

    t = parser_priv(p);
    while (t) {
		n = t->next;
		mem_free(t);
		t = n;
    }

    parser_destroy(p);
    return 0;
}